

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

void __thiscall node::anon_unknown_2::NodeImpl::startShutdown(NodeImpl *this)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  NodeContext **ppNVar3;
  SignalInterrupt **ppSVar4;
  Logger *pLVar5;
  ArgsManager *this_00;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string local_60;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppNVar3 = inline_assertion_check<true,node::NodeContext*&>
                      (&this->m_context,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                       ,0x85,"startShutdown","m_context");
  ppSVar4 = inline_assertion_check<true,util::SignalInterrupt*&>
                      (&(*ppNVar3)->shutdown,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                       ,0x85,"startShutdown","Assert(m_context)->shutdown");
  bVar2 = util::SignalInterrupt::operator()(*ppSVar4);
  if (!bVar2) {
    pLVar5 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar5);
    if (bVar2) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<>(&local_60,"Failed to send shutdown signal\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      pLVar5 = LogInstance();
      local_60._M_dataplus._M_p = (pointer)0x5c;
      local_60._M_string_length = 0x6bb643;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
      ;
      source_file._M_len = 0x5c;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "startShutdown";
      logging_function._M_len = 0xd;
      BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x86,ALL,Error);
      std::__cxx11::string::~string((string *)&log_msg);
    }
  }
  this_00 = args(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log_msg,"-server",(allocator<char> *)&local_60);
  bVar2 = ArgsManager::GetBoolArg(this_00,&log_msg,false);
  std::__cxx11::string::~string((string *)&log_msg);
  if (bVar2) {
    InterruptRPC();
    StopRPC();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void startShutdown() override
    {
        if (!(*Assert(Assert(m_context)->shutdown))()) {
            LogError("Failed to send shutdown signal\n");
        }
        // Stop RPC for clean shutdown if any of waitfor* commands is executed.
        if (args().GetBoolArg("-server", false)) {
            InterruptRPC();
            StopRPC();
        }
    }